

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O3

_Bool CheckCollisionPointCircle(Vector2 point,Vector2 center,float radius)

{
  float fVar1;
  float fVar2;
  
  fVar1 = center.x - point.x;
  fVar2 = center.y - point.y;
  return SQRT(fVar1 * fVar1 + fVar2 * fVar2) <= radius;
}

Assistant:

bool CheckCollisionCircles(Vector2 center1, float radius1, Vector2 center2, float radius2)
{
    bool collision = false;

    float dx = center2.x - center1.x;      // X distance between centers
    float dy = center2.y - center1.y;      // Y distance between centers

    float distance = sqrtf(dx*dx + dy*dy); // Distance between centers

    if (distance <= (radius1 + radius2)) collision = true;

    return collision;
}